

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O3

void assert_parse_string(char *string,char *expected)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.offset = 0;
  local_50.depth = 0;
  local_50.content = (uchar *)string;
  sVar2 = strlen(string);
  local_50.length = sVar2 + 1;
  local_50.hooks.allocate = global_hooks.allocate;
  local_50.hooks.deallocate = global_hooks.deallocate;
  local_50.hooks.reallocate = global_hooks.reallocate;
  cVar1 = parse_string(item,&local_50);
  if (cVar1 == 0) {
    UnityFail("Couldn\'t parse string.",0x35);
  }
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x26);
  }
  UnityAssertBits(0xff,0x10,(long)item[0].type,"Item doesn\'t have expected type.",0x27);
  UnityAssertBits(0x100,0,(long)item[0].type,"Item should not have a string as reference.",0x28);
  UnityAssertBits(0x200,0,(long)item[0].type,"Item should not have a const string.",0x29);
  if (item[0].valuestring == (char *)0x0) {
    UnityFail("Valuestring is NULL.",0x2a);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x2b);
  }
  UnityAssertEqualString(expected,item[0].valuestring,"The parsed result isn\'t as expected.",0x37);
  (*global_hooks.deallocate)(item[0].valuestring);
  item[0].valuestring = (char *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_parse_string(const char *string, const char *expected)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)string;
    buffer.length = strlen(string) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE_MESSAGE(parse_string(item, &buffer), "Couldn't parse string.");
    assert_is_string(item);
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, item->valuestring, "The parsed result isn't as expected.");
    global_hooks.deallocate(item->valuestring);
    item->valuestring = NULL;
}